

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiMaterial **_dest,aiMaterial *src)

{
  uint uVar1;
  aiMaterialProperty *paVar2;
  aiMaterial *this;
  aiMaterialProperty **ppaVar3;
  aiMaterialProperty *this_00;
  char *__dest;
  uint uVar4;
  uint i;
  ulong uVar5;
  
  if (src != (aiMaterial *)0x0 && _dest != (aiMaterial **)0x0) {
    this = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this);
    *_dest = this;
    aiMaterial::Clear(this);
    if (this->mProperties != (aiMaterialProperty **)0x0) {
      operator_delete__(this->mProperties);
    }
    uVar1 = src->mNumAllocated;
    this->mNumAllocated = uVar1;
    uVar4 = src->mNumProperties;
    this->mNumProperties = uVar4;
    ppaVar3 = (aiMaterialProperty **)operator_new__((ulong)uVar1 << 3);
    this->mProperties = ppaVar3;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      this_00 = (aiMaterialProperty *)operator_new(0x420);
      aiMaterialProperty::aiMaterialProperty(this_00);
      this->mProperties[uVar5] = this_00;
      paVar2 = src->mProperties[uVar5];
      uVar1 = paVar2->mDataLength;
      this_00->mDataLength = uVar1;
      __dest = (char *)operator_new__((ulong)uVar1);
      this_00->mData = __dest;
      memcpy(__dest,paVar2->mData,(ulong)uVar1);
      this_00->mIndex = paVar2->mIndex;
      this_00->mSemantic = paVar2->mSemantic;
      if (this_00 != paVar2) {
        uVar1 = (paVar2->mKey).length;
        (this_00->mKey).length = uVar1;
        memcpy((this_00->mKey).data,(paVar2->mKey).data,(ulong)uVar1);
        (this_00->mKey).data[uVar1] = '\0';
      }
      this_00->mType = paVar2->mType;
      uVar4 = this->mNumProperties;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy (aiMaterial** _dest, const aiMaterial* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMaterial* dest = (aiMaterial*) ( *_dest = new aiMaterial() );

    dest->Clear();
    delete[] dest->mProperties;

    dest->mNumAllocated  =  src->mNumAllocated;
    dest->mNumProperties =  src->mNumProperties;
    dest->mProperties    =  new aiMaterialProperty* [dest->mNumAllocated];

    for (unsigned int i = 0; i < dest->mNumProperties;++i)
    {
        aiMaterialProperty* prop  = dest->mProperties[i] = new aiMaterialProperty();
        aiMaterialProperty* sprop = src->mProperties[i];

        prop->mDataLength = sprop->mDataLength;
        prop->mData = new char[prop->mDataLength];
        ::memcpy(prop->mData,sprop->mData,prop->mDataLength);

        prop->mIndex    = sprop->mIndex;
        prop->mSemantic = sprop->mSemantic;
        prop->mKey      = sprop->mKey;
        prop->mType     = sprop->mType;
    }
}